

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

string * __thiscall
cmLocalUnixMakefileGenerator3::MaybeConvertWatcomShellCommand
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,string *cmd)

{
  bool bVar1;
  long lVar2;
  string scmd;
  string local_38;
  
  bVar1 = cmLocalGenerator::IsWatcomWMake((cmLocalGenerator *)this);
  if (((bVar1) && (bVar1 = cmsys::SystemTools::FileIsFullPath(cmd), bVar1)) &&
     (lVar2 = std::__cxx11::string::find_first_of((char *)cmd,0x403549), lVar2 != -1)) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    bVar1 = cmsys::SystemTools::GetShortPath(cmd,&local_38);
    if (bVar1) {
      cmOutputConverter::ConvertToOutputFormat
                (__return_storage_ptr__,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,&local_38,SHELL);
      std::__cxx11::string::~string((string *)&local_38);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)&local_38);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::MaybeConvertWatcomShellCommand(
  std::string const& cmd)
{
  if (this->IsWatcomWMake() && cmSystemTools::FileIsFullPath(cmd) &&
      cmd.find_first_of("( )") != std::string::npos) {
    // On Watcom WMake use the windows short path for the command
    // name.  This is needed to avoid funny quoting problems on
    // lines with shell redirection operators.
    std::string scmd;
    if (cmSystemTools::GetShortPath(cmd, scmd)) {
      return this->ConvertToOutputFormat(scmd, cmOutputConverter::SHELL);
    }
  }
  return std::string();
}